

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O0

optional<long> __thiscall b_tree_node::_search(b_tree_node *this,int64_t k)

{
  pager *p;
  undefined4 uVar1;
  bool bVar2;
  uint16_t uVar3;
  int64_t ofs;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  optional<long> oVar5;
  undefined1 local_b8 [8];
  b_tree_node child;
  undefined1 local_48;
  _Storage<long,_true> local_40;
  optional<long> result;
  int i;
  int64_t k_local;
  b_tree_node *this_local;
  undefined1 local_10;
  
  result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._12_4_
       = 0;
  while( true ) {
    uVar1 = result.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._12_4_;
    uVar3 = _num_keys(this);
    bVar2 = false;
    if ((int)uVar1 < (int)(uint)uVar3) {
      bVar2 = this->_keys_field
              [(int)result.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._12_4_] < k;
    }
    if (!bVar2) break;
    result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _12_4_ = result.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._12_4_ + 1;
  }
  std::optional<long>::optional((optional<long> *)&local_40);
  if (this->_keys_field
      [(int)result.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._12_4_] == k) {
    uVar4 = extraout_RDX;
    if (this->_valid_keys_field
        [(int)result.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._12_4_] == '\x01') {
      std::optional<long>::optional<long_&,_true>
                ((optional<long> *)&child._child_ofs_field,
                 this->_vals_field +
                 (int)result.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._12_4_);
      local_40 = (_Storage<long,_true>)child._child_ofs_field;
      result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload._M_value._0_1_ = local_48;
      uVar4 = extraout_RDX_00;
    }
    this_local = (b_tree_node *)local_40;
    local_10 = result.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value._0_1_;
  }
  else {
    bVar2 = _leaf(this);
    if (bVar2) {
      this_local = (b_tree_node *)local_40;
      local_10 = result.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload._M_value._0_1_;
      uVar4 = extraout_RDX_01;
    }
    else {
      p = this->_p;
      ofs = _child_ofs(this,result.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._12_2_);
      b_tree_node((b_tree_node *)local_b8,p,ofs);
      oVar5 = _search((b_tree_node *)local_b8,k);
      this_local = oVar5.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
      local_10 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged;
      ~b_tree_node((b_tree_node *)local_b8);
      uVar4 = extraout_RDX_02;
    }
  }
  oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)local_10;
  oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)this_local;
  return (optional<long>)
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

optional<int64_t> b_tree_node::_search(int64_t k)
{
    // Find the first key greater than or equal to k
    int i = 0;
    while (i < _num_keys() && k > _keys_field[i])
        i++;
 
    optional<int64_t> result;
    // If the found key is equal to k, return this node
    if (_keys_field[i] == k)
    {
        if(_valid_keys_field[i] == 1)
            result = _vals_field[i];
        return result;
    }
 
    // If key is not found here and this is a leaf node
    if (_leaf() == true)
        return result;
 
    // Go to the appropriate child
    b_tree_node child(_p, _child_ofs(i));
    return child._search(k);
}